

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_writer.cpp
# Opt level: O0

void __thiscall Json::StyledWriter::writeValue(StyledWriter *this,Value *value)

{
  bool bVar1;
  ValueType VVar2;
  iterator this_00;
  StyledWriter *this_01;
  StyledWriter *in_RSI;
  Value *in_RDI;
  uint unaff_retaddr;
  char *in_stack_00000008;
  Value *childValue;
  string *name;
  iterator it;
  Members members;
  bool ok;
  char *end;
  char *str;
  string *in_stack_fffffffffffffd98;
  string *value_00;
  StyledWriter *in_stack_fffffffffffffda0;
  char **in_stack_fffffffffffffda8;
  string *in_stack_fffffffffffffdb0;
  Value *in_stack_fffffffffffffdb8;
  allocator *paVar3;
  undefined8 in_stack_fffffffffffffdc8;
  undefined1 value_01;
  StyledWriter *in_stack_fffffffffffffde0;
  allocator<char> local_1f1;
  string local_1f0 [24];
  Value *in_stack_fffffffffffffe28;
  string local_1c8 [16];
  Value *in_stack_fffffffffffffe48;
  StyledWriter *in_stack_fffffffffffffe50;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_198;
  undefined1 local_189 [40];
  allocator local_161;
  string local_160 [56];
  string local_128 [39];
  allocator local_101;
  string local_100 [32];
  string local_e0 [39];
  undefined1 local_b9;
  Value *in_stack_ffffffffffffff58;
  Value *in_stack_ffffffffffffff68;
  string local_88 [32];
  string local_68 [48];
  Value *in_stack_ffffffffffffffc8;
  string local_30 [24];
  Value *in_stack_ffffffffffffffe8;
  
  value_01 = (undefined1)((ulong)in_stack_fffffffffffffdc8 >> 0x38);
  VVar2 = Value::type((Value *)in_RSI);
  this_01 = (StyledWriter *)(ulong)VVar2;
  switch(this_01) {
  case (StyledWriter *)0x0:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_30,"null",(allocator *)&stack0xffffffffffffffcf);
    pushValue(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
    std::__cxx11::string::~string(local_30);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffcf);
    break;
  case (StyledWriter *)0x1:
    Value::asLargestInt((Value *)0x131e6c);
    valueToString_abi_cxx11_((LargestInt)in_RDI);
    pushValue(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
    std::__cxx11::string::~string(local_68);
    break;
  case (StyledWriter *)0x2:
    Value::asLargestUInt((Value *)0x131ed7);
    valueToString_abi_cxx11_((LargestUInt)in_RDI);
    pushValue(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
    std::__cxx11::string::~string(local_88);
    break;
  case (StyledWriter *)0x3:
    Value::asDouble(in_stack_ffffffffffffff68);
    valueToString_abi_cxx11_((double)in_RDI);
    pushValue(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff58);
    break;
  case (StyledWriter *)0x4:
    local_b9 = Value::getString(in_stack_fffffffffffffdb8,(char **)in_stack_fffffffffffffdb0,
                                in_stack_fffffffffffffda8);
    if ((bool)local_b9) {
      valueToQuotedStringN_abi_cxx11_(in_stack_00000008,unaff_retaddr);
      pushValue(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
      std::__cxx11::string::~string(local_e0);
    }
    else {
      paVar3 = &local_101;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_100,"",paVar3);
      pushValue(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
      std::__cxx11::string::~string(local_100);
      std::allocator<char>::~allocator((allocator<char> *)&local_101);
    }
    break;
  case (StyledWriter *)0x5:
    Value::asBool(in_stack_ffffffffffffff58);
    valueToString_abi_cxx11_((bool)value_01);
    pushValue(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
    std::__cxx11::string::~string(local_128);
    break;
  case (StyledWriter *)0x6:
    writeArrayValue(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
    break;
  case (StyledWriter *)0x7:
    Value::getMemberNames_abi_cxx11_(in_stack_ffffffffffffffc8);
    bVar1 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_fffffffffffffdb0);
    if (bVar1) {
      paVar3 = &local_161;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_160,"{}",paVar3);
      pushValue(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
      std::__cxx11::string::~string(local_160);
      std::allocator<char>::~allocator((allocator<char> *)&local_161);
    }
    else {
      in_stack_fffffffffffffdb0 = (string *)local_189;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)(local_189 + 1),"{",(allocator *)in_stack_fffffffffffffdb0);
      writeWithIndent(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
      std::__cxx11::string::~string((string *)(local_189 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_189);
      indent(in_stack_fffffffffffffde0);
      local_198._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_stack_fffffffffffffd98);
      while( true ) {
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator*(&local_198);
        Value::operator[](in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0);
        writeCommentBeforeValue(this_01,in_RDI);
        std::__cxx11::string::c_str();
        valueToQuotedString_abi_cxx11_(in_stack_00000008);
        writeWithIndent(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
        std::__cxx11::string::~string(local_1c8);
        std::__cxx11::string::operator+=((string *)&in_RDI->limit_," : ");
        writeValue(in_RSI,in_stack_ffffffffffffffe8);
        in_stack_fffffffffffffda0 =
             (StyledWriter *)
             __gnu_cxx::
             __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator++(&local_198);
        this_00 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)in_stack_fffffffffffffd98);
        bVar1 = __gnu_cxx::operator==
                          ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)in_stack_fffffffffffffda0,
                           (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)in_stack_fffffffffffffd98);
        if (bVar1) break;
        std::__cxx11::string::operator+=((string *)&in_RDI->limit_,',');
        writeCommentAfterValueOnSameLine
                  ((StyledWriter *)this_00._M_current,in_stack_fffffffffffffe28);
      }
      writeCommentAfterValueOnSameLine((StyledWriter *)this_00._M_current,in_stack_fffffffffffffe28)
      ;
      unindent(in_stack_fffffffffffffda0);
      value_00 = (string *)&local_1f1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1f0,"}",(allocator *)value_00);
      writeWithIndent(in_stack_fffffffffffffda0,value_00);
      std::__cxx11::string::~string(local_1f0);
      std::allocator<char>::~allocator(&local_1f1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_fffffffffffffdb0);
  }
  return;
}

Assistant:

void StyledWriter::writeValue(const Value& value) {
  switch (value.type()) {
  case nullValue:
    pushValue("null");
    break;
  case intValue:
    pushValue(valueToString(value.asLargestInt()));
    break;
  case uintValue:
    pushValue(valueToString(value.asLargestUInt()));
    break;
  case realValue:
    pushValue(valueToString(value.asDouble()));
    break;
  case stringValue:
  {
    // Is NULL possible for value.string_?
    char const* str;
    char const* end;
    bool ok = value.getString(&str, &end);
    if (ok) pushValue(valueToQuotedStringN(str, static_cast<unsigned>(end-str)));
    else pushValue("");
    break;
  }
  case booleanValue:
    pushValue(valueToString(value.asBool()));
    break;
  case arrayValue:
    writeArrayValue(value);
    break;
  case objectValue: {
    Value::Members members(value.getMemberNames());
    if (members.empty())
      pushValue("{}");
    else {
      writeWithIndent("{");
      indent();
      Value::Members::iterator it = members.begin();
      for (;;) {
        const std::string& name = *it;
        const Value& childValue = value[name];
        writeCommentBeforeValue(childValue);
        writeWithIndent(valueToQuotedString(name.c_str()));
        document_ += " : ";
        writeValue(childValue);
        if (++it == members.end()) {
          writeCommentAfterValueOnSameLine(childValue);
          break;
        }
        document_ += ',';
        writeCommentAfterValueOnSameLine(childValue);
      }
      unindent();
      writeWithIndent("}");
    }
  } break;
  }
}